

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O3

void __thiscall chrono::ChMarker::ArchiveOUT(ChMarker *this,ChArchiveOut *marchive)

{
  eChMarkerMotion_mapper mmapper;
  ChEnumMapper<chrono::ChMarker::eChMarkerMotion> local_78;
  eChMarkerMotion_mapper local_58;
  char *local_38;
  undefined1 *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChMarker>(marchive);
  ChObj::ArchiveOUT(&this->super_ChObj,marchive);
  ChFrameMoving<double>::ArchiveOUT(&this->super_ChFrameMoving<double>,marchive);
  eChMarkerMotion_mapper::eChMarkerMotion_mapper(&local_58);
  eChMarkerMotion_mapper::operator()(&local_78,&local_58,&this->motion_type);
  local_38 = "motion_type";
  local_28 = 0;
  local_30 = (undefined1 *)&local_78;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xb])(marchive);
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b03660
  ;
  if (local_78.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78.value_ptr = (eChMarkerMotion *)&this->motion_X;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x954785;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_78);
  local_78.value_ptr = (eChMarkerMotion *)&this->motion_Y;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x95478e;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_78);
  local_78.value_ptr = (eChMarkerMotion *)&this->motion_Z;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x954797;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_78);
  local_78.value_ptr = (eChMarkerMotion *)&this->motion_ang;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9547a0;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_78);
  local_78.value_ptr = (eChMarkerMotion *)&this->motion_axis;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9547ab;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)&local_78);
  local_58.super_ChEnumMapper<chrono::ChMarker::eChMarkerMotion>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b03660;
  if (local_58.super_ChEnumMapper<chrono::ChMarker::eChMarkerMotion>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super_ChEnumMapper<chrono::ChMarker::eChMarkerMotion>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChMarker::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChMarker>();

    // serialize parent class
    ChObj::ArchiveOUT(marchive);
    // serialize parent class
    ChFrameMoving<double>::ArchiveOUT(marchive);

    // serialize all member data:
    eChMarkerMotion_mapper mmapper;
    marchive << CHNVP(mmapper(motion_type), "motion_type");
    marchive << CHNVP(motion_X);
    marchive << CHNVP(motion_Y);
    marchive << CHNVP(motion_Z);
    marchive << CHNVP(motion_ang);
    marchive << CHNVP(motion_axis);
}